

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::MultiTexShader::shadeVertices
          (MultiTexShader *this,VertexAttrib *inputs,VertexPacket **packets,int numPackets)

{
  VertexPacket *pVVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)numPackets;
  if (numPackets < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    pVVar1 = packets[uVar3];
    rr::readVertexAttribFloat((rr *)&local_48,inputs,pVVar1->instanceNdx,pVVar1->vertexNdx);
    *(undefined8 *)(pVVar1->position).m_data = local_48;
    *(undefined8 *)((pVVar1->position).m_data + 2) = uStack_40;
    rr::readVertexAttribFloat((rr *)&local_48,inputs + 1,pVVar1->instanceNdx,pVVar1->vertexNdx);
    *(undefined8 *)&pVVar1->outputs[0].v = local_48;
    *(undefined8 *)((long)&pVVar1->outputs[0].v + 8) = uStack_40;
  }
  return;
}

Assistant:

void MultiTexShader::shadeVertices (const rr::VertexAttrib* inputs, rr::VertexPacket* const* packets, const int numPackets) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		rr::VertexPacket& packet = *(packets[packetNdx]);

		packet.position		= rr::readVertexAttribFloat(inputs[0], packet.instanceNdx, packet.vertexNdx);
		packet.outputs[0]	= rr::readVertexAttribFloat(inputs[1], packet.instanceNdx, packet.vertexNdx);
	}
}